

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  opj_tcd_tile_t *poVar6;
  opj_tcd_tilecomp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  opj_tcd_pass_t *poVar11;
  bool bVar12;
  uint uVar13;
  OPJ_FLOAT64 *pOVar14;
  opj_tcd_layer_t *poVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  OPJ_FLOAT64 OVar28;
  OPJ_BOOL local_a8;
  
  poVar6 = tcd->tcd_image->tiles;
  poVar6->distolayer[layno] = 0.0;
  uVar2 = poVar6->numcomps;
  if ((ulong)uVar2 == 0) {
    local_a8 = 1;
  }
  else {
    poVar7 = poVar6->comps;
    local_a8 = 1;
    uVar19 = 0;
    do {
      uVar20 = (ulong)poVar7[uVar19].numresolutions;
      if (uVar20 != 0) {
        poVar8 = poVar7[uVar19].resolutions;
        uVar22 = 0;
        do {
          uVar3 = poVar8[uVar22].numbands;
          if ((ulong)uVar3 != 0) {
            uVar25 = 0;
            do {
              if (((poVar8[uVar22].bands[uVar25].x1 != poVar8[uVar22].bands[uVar25].x0) &&
                  (poVar8[uVar22].bands[uVar25].y1 != poVar8[uVar22].bands[uVar25].y0)) &&
                 (uVar17 = poVar8[uVar22].ph * poVar8[uVar22].pw, uVar17 != 0)) {
                poVar9 = poVar8[uVar22].bands[uVar25].precincts;
                uVar16 = 0;
                do {
                  uVar13 = poVar9[uVar16].ch * poVar9[uVar16].cw;
                  if (uVar13 != 0) {
                    uVar26 = 0;
                    do {
                      poVar10 = poVar9[uVar16].cblks.enc;
                      poVar1 = poVar10 + uVar26;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                      }
                      if (0.0 <= (double)thresh) {
                        uVar18 = poVar1->numpassesinlayers;
                        uVar21 = (ulong)uVar18;
                        if (uVar18 < poVar1->totalpasses) {
                          poVar11 = poVar1->passes;
                          pOVar14 = &poVar11[uVar21].distortiondec;
                          uVar24 = uVar21;
                          do {
                            uVar18 = ((opj_tcd_pass_t *)(pOVar14 + -1))->rate;
                            uVar23 = (uint)uVar24;
                            if (uVar23 == 0) {
                              dVar27 = (double)*pOVar14;
                            }
                            else {
                              uVar18 = uVar18 - poVar11[uVar23 - 1].rate;
                              dVar27 = (double)*pOVar14 - (double)poVar11[uVar23 - 1].distortiondec;
                            }
                            if (uVar18 == 0) {
                              bVar12 = dVar27 != 0.0;
                            }
                            else {
                              bVar12 = (double)thresh - dVar27 / (double)uVar18 <
                                       2.220446049250313e-16;
                            }
                            uVar21 = uVar21 + 1;
                            uVar18 = (uint)uVar21;
                            if (!bVar12) {
                              uVar18 = uVar23;
                            }
                            pOVar14 = pOVar14 + 3;
                            uVar24 = (ulong)uVar18;
                          } while (poVar1->totalpasses != uVar21);
                        }
                      }
                      else {
                        uVar18 = poVar1->totalpasses;
                      }
                      poVar15 = poVar10[uVar26].layers + layno;
                      OVar4 = poVar1->numpassesinlayers;
                      if (poVar15->numpasses != uVar18 - OVar4) {
                        poVar15->numpasses = uVar18 - OVar4;
                        local_a8 = 0;
                      }
                      if (poVar15->numpasses == 0) {
                        poVar15->disto = 0.0;
                      }
                      else {
                        uVar23 = uVar18 - 1;
                        poVar11 = poVar1->passes;
                        if (OVar4 == 0) {
                          poVar15->len = poVar11[uVar23].rate;
                          poVar15->data = poVar1->data;
                          OVar28 = poVar11[uVar23].distortiondec;
                        }
                        else {
                          uVar5 = poVar11[OVar4 - 1].rate;
                          poVar15->len = poVar11[uVar23].rate - uVar5;
                          poVar15->data = poVar1->data + uVar5;
                          OVar28 = (OPJ_FLOAT64)
                                   ((double)poVar11[uVar23].distortiondec -
                                   (double)poVar11[OVar4 - 1].distortiondec);
                        }
                        poVar15->disto = OVar28;
                        poVar6->distolayer[layno] =
                             (OPJ_FLOAT64)((double)OVar28 + (double)poVar6->distolayer[layno]);
                        if (final != 0) {
                          poVar1->numpassesinlayers = uVar18;
                        }
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar13);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != uVar17);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar3);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar20);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar2);
  }
  return local_a8;
}

Assistant:

static
OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,
                           OPJ_UINT32 layno,
                           OPJ_FLOAT64 thresh,
                           OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_UINT32 passno;

    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    OPJ_BOOL layer_allocation_is_same = OPJ_TRUE;

    tcd_tile->distolayer[layno] = 0;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;

                        if (thresh < 0) {
                            /* Special value to indicate to use all passes */
                            n = cblk->totalpasses;
                        } else {
                            for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                OPJ_UINT32 dr;
                                OPJ_FLOAT64 dd;
                                opj_tcd_pass_t *pass = &cblk->passes[passno];

                                if (n == 0) {
                                    dr = pass->rate;
                                    dd = pass->distortiondec;
                                } else {
                                    dr = pass->rate - cblk->passes[n - 1].rate;
                                    dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                }

                                if (!dr) {
                                    if (dd != 0) {
                                        n = passno + 1;
                                    }
                                    continue;
                                }
                                if (thresh - (dd / dr) <
                                        DBL_EPSILON) { /* do not rely on float equality, check with DBL_EPSILON margin */
                                    n = passno + 1;
                                }
                            }
                        }

                        if (layer->numpasses != n - cblk->numpassesinlayers) {
                            layer_allocation_is_same = OPJ_FALSE;
                            layer->numpasses = n - cblk->numpassesinlayers;
                        }

                        if (!layer->numpasses) {
                            layer->disto = 0;
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                            layer->disto = cblk->passes[n - 1].distortiondec;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                            layer->disto = cblk->passes[n - 1].distortiondec -
                                           cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                        }

                        tcd_tile->distolayer[layno] += layer->disto;

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
    return layer_allocation_is_same;
}